

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guard_builder.cpp
# Opt level: O0

void __thiscall
r_exec::SGuardBuilder::_build
          (SGuardBuilder *this,Code *mdl,uint16_t q0,uint16_t t0,uint16_t t1,uint16_t *write_index)

{
  int iVar1;
  undefined4 extraout_var;
  long *plVar2;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  ushort uVar3;
  Atom local_a4 [4];
  Atom local_a0 [4];
  Atom local_9c [4];
  Atom local_98 [4];
  Atom local_94 [4];
  Atom local_90 [4];
  Atom local_8c [4];
  Atom local_88 [4];
  Atom local_84 [4];
  Atom local_80 [4];
  Atom local_7c [4];
  Atom local_78 [4];
  Atom local_74 [4];
  Atom local_70 [4];
  Atom local_6c [4];
  Atom local_68 [6];
  uint16_t local_62;
  Atom local_60 [6];
  uint16_t extent_index;
  Atom local_4c [6];
  ushort local_46;
  uint16_t local_44;
  uint16_t local_42;
  uint16_t speed_value;
  uint16_t speed_t1;
  long *plStack_40;
  uint16_t speed_t0;
  Code *lhs;
  uint16_t q1;
  uint16_t t3;
  long *plStack_30;
  uint16_t t2;
  Code *rhs;
  uint16_t *write_index_local;
  uint16_t t1_local;
  uint16_t t0_local;
  Code *pCStack_18;
  uint16_t q0_local;
  Code *mdl_local;
  SGuardBuilder *this_local;
  
  rhs = (Code *)write_index;
  write_index_local._2_2_ = t1;
  write_index_local._4_2_ = t0;
  write_index_local._6_2_ = q0;
  pCStack_18 = mdl;
  mdl_local = (Code *)this;
  iVar1 = (*(mdl->super__Object)._vptr__Object[9])(mdl,1);
  plStack_30 = (long *)CONCAT44(extraout_var,iVar1);
  (**(code **)(*plStack_30 + 0x20))();
  lhs._6_2_ = r_code::Atom::asIndex();
  (**(code **)(*plStack_30 + 0x20))();
  lhs._4_2_ = r_code::Atom::asIndex();
  plVar2 = (long *)(**(code **)(*plStack_30 + 0x48))();
  (**(code **)(*plVar2 + 0x20))(plVar2,3);
  lhs._2_2_ = r_code::Atom::asIndex();
  iVar1 = (*(pCStack_18->super__Object)._vptr__Object[9])(pCStack_18,0);
  plStack_40 = (long *)CONCAT44(extraout_var_00,iVar1);
  (**(code **)(*plStack_40 + 0x20))(plStack_40,2);
  local_42 = r_code::Atom::asIndex();
  (**(code **)(*plStack_40 + 0x20))(plStack_40,3);
  local_44 = r_code::Atom::asIndex();
  plVar2 = (long *)(**(code **)(*plStack_40 + 0x48))(plStack_40,0);
  (**(code **)(*plVar2 + 0x20))(plVar2,3);
  local_46 = r_code::Atom::asIndex();
  *(short *)&(rhs->super__Object)._vptr__Object = *(short *)&(rhs->super__Object)._vptr__Object + 1;
  r_code::Atom::IPointer((ushort)local_4c);
  iVar1 = (*(pCStack_18->super__Object)._vptr__Object[4])(pCStack_18,3);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar1),local_4c);
  r_code::Atom::~Atom(local_4c);
  r_code::Atom::Set((uchar)local_60);
  iVar1 = (*(pCStack_18->super__Object)._vptr__Object[4])
                    (pCStack_18,(ulong)*(ushort *)&(rhs->super__Object)._vptr__Object);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_02,iVar1),local_60);
  r_code::Atom::~Atom(local_60);
  local_62 = *(short *)&(rhs->super__Object)._vptr__Object + 3;
  TimingGuardBuilder::write_guard
            (&this->super_TimingGuardBuilder,pCStack_18,lhs._6_2_,write_index_local._4_2_,
             Opcodes::Add,(this->super_TimingGuardBuilder).period,(uint16_t *)rhs,&local_62);
  TimingGuardBuilder::write_guard
            (&this->super_TimingGuardBuilder,pCStack_18,lhs._4_2_,write_index_local._2_2_,
             Opcodes::Add,(this->super_TimingGuardBuilder).period,(uint16_t *)rhs,&local_62);
  local_62 = local_62 + 1;
  r_code::Atom::AssignmentPointer((uchar)local_68,lhs._2_2_ & 0xff);
  uVar3 = *(short *)&(rhs->super__Object)._vptr__Object + 1;
  *(ushort *)&(rhs->super__Object)._vptr__Object = uVar3;
  iVar1 = (*(pCStack_18->super__Object)._vptr__Object[4])(pCStack_18,(ulong)uVar3);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_03,iVar1),local_68);
  r_code::Atom::~Atom(local_68);
  r_code::Atom::Operator((ushort)local_6c,(uchar)Opcodes::Add);
  iVar1 = (*(pCStack_18->super__Object)._vptr__Object[4])(pCStack_18,(ulong)local_62);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_04,iVar1),local_6c);
  r_code::Atom::~Atom(local_6c);
  r_code::Atom::VLPointer((ushort)local_70,write_index_local._6_2_);
  local_62 = local_62 + 1;
  iVar1 = (*(pCStack_18->super__Object)._vptr__Object[4])(pCStack_18,(ulong)local_62);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_05,iVar1),local_70);
  r_code::Atom::~Atom(local_70);
  local_62 = local_62 + 1;
  r_code::Atom::IPointer((ushort)local_74);
  iVar1 = (*(pCStack_18->super__Object)._vptr__Object[4])(pCStack_18,(ulong)local_62);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_06,iVar1),local_74);
  r_code::Atom::~Atom(local_74);
  r_code::Atom::Operator((ushort)local_78,(uchar)Opcodes::Mul);
  local_62 = local_62 + 1;
  iVar1 = (*(pCStack_18->super__Object)._vptr__Object[4])(pCStack_18,(ulong)local_62);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_07,iVar1),local_78);
  r_code::Atom::~Atom(local_78);
  r_code::Atom::VLPointer((ushort)local_7c,local_46);
  local_62 = local_62 + 1;
  iVar1 = (*(pCStack_18->super__Object)._vptr__Object[4])(pCStack_18,(ulong)local_62);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_08,iVar1),local_7c);
  r_code::Atom::~Atom(local_7c);
  local_62 = local_62 + 1;
  r_code::Atom::IPointer((ushort)local_80);
  iVar1 = (*(pCStack_18->super__Object)._vptr__Object[4])(pCStack_18,(ulong)local_62);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_09,iVar1),local_80);
  r_code::Atom::~Atom(local_80);
  local_62 = local_62 + 1;
  r_code::Utils::SetTimestamp(pCStack_18,local_62,(this->super_TimingGuardBuilder).period);
  local_62 = local_62 + 2;
  *(uint16_t *)&(rhs->super__Object)._vptr__Object = local_62;
  *(short *)&(rhs->super__Object)._vptr__Object = *(short *)&(rhs->super__Object)._vptr__Object + 1;
  r_code::Atom::IPointer((ushort)local_84);
  iVar1 = (*(pCStack_18->super__Object)._vptr__Object[4])(pCStack_18,4);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_10,iVar1),local_84);
  r_code::Atom::~Atom(local_84);
  r_code::Atom::Set((uchar)local_88);
  iVar1 = (*(pCStack_18->super__Object)._vptr__Object[4])
                    (pCStack_18,(ulong)*(ushort *)&(rhs->super__Object)._vptr__Object);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_11,iVar1),local_88);
  r_code::Atom::~Atom(local_88);
  local_62 = *(short *)&(rhs->super__Object)._vptr__Object + 5;
  TimingGuardBuilder::write_guard
            (&this->super_TimingGuardBuilder,pCStack_18,write_index_local._4_2_,lhs._6_2_,
             Opcodes::Sub,(this->super_TimingGuardBuilder).period,(uint16_t *)rhs,&local_62);
  TimingGuardBuilder::write_guard
            (&this->super_TimingGuardBuilder,pCStack_18,write_index_local._2_2_,lhs._4_2_,
             Opcodes::Sub,(this->super_TimingGuardBuilder).period,(uint16_t *)rhs,&local_62);
  TimingGuardBuilder::write_guard
            (&this->super_TimingGuardBuilder,pCStack_18,local_42,lhs._6_2_,Opcodes::Sub,this->offset
             ,(uint16_t *)rhs,&local_62);
  TimingGuardBuilder::write_guard
            (&this->super_TimingGuardBuilder,pCStack_18,local_44,lhs._4_2_,Opcodes::Sub,this->offset
             ,(uint16_t *)rhs,&local_62);
  local_62 = local_62 + 1;
  r_code::Atom::AssignmentPointer((uchar)local_8c,local_46 & 0xff);
  uVar3 = *(short *)&(rhs->super__Object)._vptr__Object + 1;
  *(ushort *)&(rhs->super__Object)._vptr__Object = uVar3;
  iVar1 = (*(pCStack_18->super__Object)._vptr__Object[4])(pCStack_18,(ulong)uVar3);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_12,iVar1),local_8c);
  r_code::Atom::~Atom(local_8c);
  r_code::Atom::Operator((ushort)local_90,(uchar)Opcodes::Div);
  iVar1 = (*(pCStack_18->super__Object)._vptr__Object[4])(pCStack_18,(ulong)local_62);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_13,iVar1),local_90);
  r_code::Atom::~Atom(local_90);
  local_62 = local_62 + 1;
  r_code::Atom::IPointer((ushort)local_94);
  iVar1 = (*(pCStack_18->super__Object)._vptr__Object[4])(pCStack_18,(ulong)local_62);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_14,iVar1),local_94);
  r_code::Atom::~Atom(local_94);
  local_62 = local_62 + 1;
  r_code::Atom::IPointer((ushort)local_98);
  iVar1 = (*(pCStack_18->super__Object)._vptr__Object[4])(pCStack_18,(ulong)local_62);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_15,iVar1),local_98);
  r_code::Atom::~Atom(local_98);
  r_code::Atom::Operator((ushort)local_9c,(uchar)Opcodes::Sub);
  local_62 = local_62 + 1;
  iVar1 = (*(pCStack_18->super__Object)._vptr__Object[4])(pCStack_18,(ulong)local_62);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_16,iVar1),local_9c);
  r_code::Atom::~Atom(local_9c);
  r_code::Atom::VLPointer((ushort)local_a0,lhs._2_2_);
  local_62 = local_62 + 1;
  iVar1 = (*(pCStack_18->super__Object)._vptr__Object[4])(pCStack_18,(ulong)local_62);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_17,iVar1),local_a0);
  r_code::Atom::~Atom(local_a0);
  r_code::Atom::VLPointer((ushort)local_a4,write_index_local._6_2_);
  local_62 = local_62 + 1;
  iVar1 = (*(pCStack_18->super__Object)._vptr__Object[4])(pCStack_18,(ulong)local_62);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_18,iVar1),local_a4);
  r_code::Atom::~Atom(local_a4);
  local_62 = local_62 + 1;
  r_code::Utils::SetTimestamp(pCStack_18,local_62,(this->super_TimingGuardBuilder).period);
  *(uint16_t *)&(rhs->super__Object)._vptr__Object = local_62 + 2;
  return;
}

Assistant:

void SGuardBuilder::_build(Code *mdl, uint16_t q0, uint16_t t0, uint16_t t1, uint16_t &write_index) const
{
    Code *rhs = mdl->get_reference(1);
    uint16_t t2 = rhs->code(FACT_AFTER).asIndex();
    uint16_t t3 = rhs->code(FACT_BEFORE).asIndex();
    uint16_t q1 = rhs->get_reference(0)->code(MK_VAL_VALUE).asIndex();
    Code *lhs = mdl->get_reference(0);
    uint16_t speed_t0 = lhs->code(FACT_AFTER).asIndex();
    uint16_t speed_t1 = lhs->code(FACT_BEFORE).asIndex();
    uint16_t speed_value = lhs->get_reference(0)->code(MK_VAL_VALUE).asIndex();
    mdl->code(MDL_FWD_GUARDS) = Atom::IPointer(++write_index);
    mdl->code(write_index) = Atom::Set(3);
    uint16_t extent_index = write_index + 3;
    write_guard(mdl, t2, t0, Opcodes::Add, period, write_index, extent_index);
    write_guard(mdl, t3, t1, Opcodes::Add, period, write_index, extent_index);
    mdl->code(++write_index) = Atom::AssignmentPointer(q1, ++extent_index);
    mdl->code(extent_index) = Atom::Operator(Opcodes::Add, 2); // q1:(+ q0 (* s period))
    mdl->code(++extent_index) = Atom::VLPointer(q0);
    extent_index++;
    mdl->code(extent_index) = Atom::IPointer(extent_index + 1);
    mdl->code(++extent_index) = Atom::Operator(Opcodes::Mul, 2);
    mdl->code(++extent_index) = Atom::VLPointer(speed_value);
    extent_index++;
    mdl->code(extent_index) = Atom::IPointer(extent_index + 1);
    Utils::SetTimestamp(mdl, ++extent_index, period);
    extent_index += 2;
    write_index = extent_index;
    mdl->code(MDL_BWD_GUARDS) = Atom::IPointer(++write_index);
    mdl->code(write_index) = Atom::Set(5);
    extent_index = write_index + 5;
    write_guard(mdl, t0, t2, Opcodes::Sub, period, write_index, extent_index);
    write_guard(mdl, t1, t3, Opcodes::Sub, period, write_index, extent_index);
    write_guard(mdl, speed_t0, t2, Opcodes::Sub, offset, write_index, extent_index);
    write_guard(mdl, speed_t1, t3, Opcodes::Sub, offset, write_index, extent_index);
    mdl->code(++write_index) = Atom::AssignmentPointer(speed_value, ++extent_index);
    mdl->code(extent_index) = Atom::Operator(Opcodes::Div, 2); // s:(/ (- q1 q0) period)
    extent_index++;
    mdl->code(extent_index) = Atom::IPointer(extent_index + 2);
    extent_index++;
    mdl->code(extent_index) = Atom::IPointer(extent_index + 4);
    mdl->code(++extent_index) = Atom::Operator(Opcodes::Sub, 2);
    mdl->code(++extent_index) = Atom::VLPointer(q1);
    mdl->code(++extent_index) = Atom::VLPointer(q0);
    Utils::SetTimestamp(mdl, ++extent_index, period);
    extent_index += 2;
    write_index = extent_index;
}